

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uchar * lodepng_chunk_next(uchar *chunk,uchar *end)

{
  uint uVar1;
  
  if (0xb < (long)end - (long)chunk && chunk < end) {
    if (((((*chunk == 0x89) && (chunk[1] == 'P')) && (chunk[2] == 'N')) &&
        ((chunk[3] == 'G' && (chunk[4] == '\r')))) &&
       ((chunk[5] == '\n' && ((chunk[6] == '\x1a' && (chunk[7] == '\n')))))) {
      end = chunk + 8;
    }
    else {
      uVar1 = lodepng_read32bitInt(chunk);
      end = chunk + (ulong)uVar1 + 0xc;
    }
  }
  return end;
}

Assistant:

unsigned char* lodepng_chunk_next(unsigned char* chunk, unsigned char* end) {
  if(chunk >= end || end - chunk < 12) return end; /*too small to contain a chunk*/
  if(chunk[0] == 0x89 && chunk[1] == 0x50 && chunk[2] == 0x4e && chunk[3] == 0x47
    && chunk[4] == 0x0d && chunk[5] == 0x0a && chunk[6] == 0x1a && chunk[7] == 0x0a) {
    /* Is PNG magic header at start of PNG file. Jump to first actual chunk. */
    return chunk + 8;
  } else {
    size_t total_chunk_length;
    unsigned char* result;
    if(lodepng_addofl(lodepng_chunk_length(chunk), 12, &total_chunk_length)) return end;
    result = chunk + total_chunk_length;
    if(result < chunk) return end; /*pointer overflow*/
    return result;
  }
}